

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ExprListSetName(Parse *pParse,ExprList *pList,Token *pName,int dequote)

{
  int iVar1;
  char *z;
  
  if (pList != (ExprList *)0x0) {
    iVar1 = pList->nExpr;
    z = sqlite3DbStrNDup(pParse->db,pName->z,(ulong)pName->n);
    pList->a[(long)iVar1 + -1].zName = z;
    if (dequote != 0) {
      sqlite3Dequote(z);
    }
    if (1 < pParse->eParseMode) {
      sqlite3RenameTokenMap(pParse,pList->a[(long)iVar1 + -1].zName,pName);
      return;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprListSetName(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to add the span. */
  Token *pName,           /* Name to be added */
  int dequote             /* True to cause the name to be dequoted */
){
  assert( pList!=0 || pParse->db->mallocFailed!=0 );
  if( pList ){
    struct ExprList_item *pItem;
    assert( pList->nExpr>0 );
    pItem = &pList->a[pList->nExpr-1];
    assert( pItem->zName==0 );
    pItem->zName = sqlite3DbStrNDup(pParse->db, pName->z, pName->n);
    if( dequote ) sqlite3Dequote(pItem->zName);
    if( IN_RENAME_OBJECT ){
      sqlite3RenameTokenMap(pParse, (void*)pItem->zName, pName);
    }
  }
}